

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O3

void __thiscall
duckdb::StreamingWindowState::LeadLagState::ExecuteLead
          (LeadLagState *this,ExecutionContext *context,DataChunk *input,DataChunk *delayed,
          Vector *result)

{
  DataChunk *this_00;
  ulong source_count;
  idx_t iVar1;
  reference source;
  ulong source_offset;
  ulong source_count_00;
  ulong target_offset;
  
  source_count = input->count;
  this_00 = &this->curr_chunk;
  source = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
  source_offset = this->buffered;
  target_offset = source_count - source_offset;
  if (source_count < source_offset || target_offset == 0) {
    target_offset = 0;
  }
  else {
    iVar1 = (this->curr_chunk).capacity;
    DataChunk::Reset(this_00);
    (this->curr_chunk).capacity = iVar1;
    ExpressionExecutor::Execute(&this->executor,input,this_00);
    VectorOperations::Copy(source,result,source_count,source_offset,0);
    source_offset = source_count;
  }
  if (source_offset < delayed->count + source_count) {
    iVar1 = (this->curr_chunk).capacity;
    DataChunk::Reset(this_00);
    (this->curr_chunk).capacity = iVar1;
    ExpressionExecutor::Execute(&this->executor,delayed,this_00);
    source_count_00 = source_offset - target_offset;
    if (delayed->count < source_offset - target_offset) {
      source_count_00 = delayed->count;
    }
    VectorOperations::Copy(source,result,source_count_00,source_offset - source_count,target_offset)
    ;
    target_offset = (target_offset - (source_offset - source_count)) + source_count_00;
  }
  if (source_count < target_offset || source_count - target_offset == 0) {
    return;
  }
  VectorOperations::Copy(&this->prev,result,source_count - target_offset,0,target_offset);
  return;
}

Assistant:

void ExecuteLead(ExecutionContext &context, DataChunk &input, DataChunk &delayed, Vector &result) {
			//	We treat input || delayed as a logical unified buffer
			D_ASSERT(offset < 0);
			// Input has been set up with the number of rows we CAN produce.
			const idx_t count = input.size();
			auto &curr = curr_chunk.data[0];
			// Copy unified[buffered:count] => result[pos:]
			idx_t pos = 0;
			idx_t unified_offset = buffered;
			if (unified_offset < count) {
				Reset(curr_chunk);
				executor.Execute(input, curr_chunk);
				VectorOperations::Copy(curr, result, count, unified_offset, pos);
				pos += count - unified_offset;
				unified_offset = count;
			}
			// Copy unified[unified_offset:] => result[pos:]
			idx_t unified_count = count + delayed.size();
			if (unified_offset < unified_count) {
				Reset(curr_chunk);
				executor.Execute(delayed, curr_chunk);
				idx_t delayed_offset = unified_offset - count;
				// Only copy as many values as we need
				idx_t delayed_count = MinValue<idx_t>(delayed.size(), delayed_offset + (count - pos));
				VectorOperations::Copy(curr, result, delayed_count, delayed_offset, pos);
				pos += delayed_count - delayed_offset;
			}
			// Copy default[:count-pos] => result[pos:]
			if (pos < count) {
				const idx_t defaulted = count - pos;
				VectorOperations::Copy(prev, result, defaulted, 0, pos);
			}
		}